

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_arrayinsert(HSQUIRRELVM v,SQInteger idx,SQInteger destpos)

{
  bool bVar1;
  SQInteger SVar2;
  SQObjectPtr **in_RDX;
  undefined8 in_RSI;
  SQObjectType type;
  HSQUIRRELVM in_RDI;
  SQInteger unaff_retaddr;
  SQArray *in_stack_00000008;
  SQRESULT ret;
  SQObjectPtr *arr;
  SQChar *in_stack_ffffffffffffffb8;
  SQVM *this;
  long local_28;
  HSQUIRRELVM in_stack_fffffffffffffff8;
  SQRESULT SVar3;
  
  type = (SQObjectType)((ulong)in_RSI >> 0x20);
  SVar2 = sq_gettop(in_RDI);
  if (SVar2 < 1) {
    SQVM::Raise_Error(in_RDI,"not enough params in the stack");
    SVar3 = -1;
  }
  else {
    bVar1 = sq_aux_gettypedarg(in_stack_fffffffffffffff8,(SQInteger)in_RDI,type,in_RDX);
    if (bVar1) {
      this = *(SQVM **)(local_28 + 8);
      SQVM::GetUp(this,(SQInteger)in_stack_ffffffffffffffb8);
      bVar1 = SQArray::Insert(in_stack_00000008,unaff_retaddr,(SQObject *)in_stack_fffffffffffffff8)
      ;
      if (bVar1) {
        SVar3 = 0;
      }
      else {
        SVar3 = sq_throwerror(this,in_stack_ffffffffffffffb8);
      }
      SQVM::Pop((SQVM *)0x10e60d);
    }
    else {
      SVar3 = -1;
    }
  }
  return SVar3;
}

Assistant:

SQRESULT sq_arrayinsert(HSQUIRRELVM v,SQInteger idx,SQInteger destpos)
{
    sq_aux_paramscheck(v, 1);
    SQObjectPtr *arr;
    _GETSAFE_OBJ(v, idx, OT_ARRAY,arr);
    SQRESULT ret = _array(*arr)->Insert(destpos, v->GetUp(-1)) ? SQ_OK : sq_throwerror(v,_SC("index out of range"));
    v->Pop();
    return ret;
}